

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::RgbaOutputFile::ToYca::ToYca(ToYca *this,OutputFile *outputFile,RgbaChannels rgbaChannels)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  LineOrder *pLVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  Rgba *pRVar8;
  uint in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  int i;
  ptrdiff_t pad;
  Box2i dw;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffff48;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffff50;
  Rgba *local_a0;
  Rgba *local_70;
  Header *in_stack_ffffffffffffff98;
  int local_48;
  Vec3<float> local_30;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  uint local_14;
  undefined8 local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::mutex::mutex((mutex *)0x21de40);
  *(undefined8 *)(in_RDI + 0x28) = local_10;
  Imath_3_2::Vec3<float>::Vec3((Vec3<float> *)(in_RDI + 0x4c));
  *(char *)(in_RDI + 0x30) = (char)((local_14 & 0x10) >> 4);
  *(char *)(in_RDI + 0x31) = (char)((local_14 & 0x20) >> 5);
  *(byte *)(in_RDI + 0x32) = -((local_14 >> 3 & 1) != 0) & 1;
  OutputFile::header(*(OutputFile **)(in_RDI + 0x28));
  Header::dataWindow((Header *)0x21dea5);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  *(int *)(in_RDI + 0x34) = local_24;
  *(int *)(in_RDI + 0x38) = (local_1c - local_24) + 1;
  *(int *)(in_RDI + 0x3c) = (local_18 - local_20) + 1;
  *(undefined4 *)(in_RDI + 0x40) = 0;
  OutputFile::header(*(OutputFile **)(in_RDI + 0x28));
  pLVar3 = Header::lineOrder((Header *)0x21df04);
  *(LineOrder *)(in_RDI + 0x44) = *pLVar3;
  if (*(int *)(in_RDI + 0x44) == 0) {
    *(int *)(in_RDI + 0x48) = local_20;
  }
  else {
    *(int *)(in_RDI + 0x48) = local_18;
  }
  OutputFile::header(*(OutputFile **)(in_RDI + 0x28));
  anon_unknown_1::ywFromHeader(in_stack_ffffffffffffff98);
  Imath_3_2::Vec3<float>::operator=((Vec3<float> *)(in_RDI + 0x4c),&local_30);
  uVar4 = anon_unknown_1::cachePadding((long)*(int *)(in_RDI + 0x38) << 3);
  lVar5 = (long)*(int *)(in_RDI + 0x38) + (uVar4 >> 3);
  uVar6 = lVar5 * 0x1b;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar6;
  uVar7 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pRVar8 = (Rgba *)operator_new__(uVar7);
  if (uVar6 != 0) {
    local_70 = pRVar8;
    do {
      Rgba::Rgba(local_70);
      local_70 = local_70 + 1;
    } while (local_70 != pRVar8 + lVar5 * 0x1b);
  }
  *(Rgba **)(in_RDI + 0x58) = pRVar8;
  for (local_48 = 0; local_48 < 0x1b; local_48 = local_48 + 1) {
    *(ulong *)(in_RDI + 0x60 + (long)local_48 * 8) =
         *(long *)(in_RDI + 0x58) +
         (long)local_48 * ((long)*(int *)(in_RDI + 0x38) + (uVar4 >> 3)) * 8;
  }
  uVar4 = (ulong)(*(int *)(in_RDI + 0x38) + 0x1a);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar4;
  uVar6 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pRVar8 = (Rgba *)operator_new__(uVar6);
  if (uVar4 != 0) {
    local_a0 = pRVar8;
    do {
      Rgba::Rgba(local_a0);
      local_a0 = local_a0 + 1;
    } while (local_a0 != pRVar8 + uVar4);
  }
  *(Rgba **)(in_RDI + 0x138) = pRVar8;
  *(undefined8 *)(in_RDI + 0x140) = 0;
  *(undefined8 *)(in_RDI + 0x148) = 0;
  *(undefined8 *)(in_RDI + 0x150) = 0;
  *(undefined4 *)(in_RDI + 0x158) = 7;
  *(undefined4 *)(in_RDI + 0x15c) = 5;
  return;
}

Assistant:

RgbaOutputFile::ToYca::ToYca (OutputFile& outputFile, RgbaChannels rgbaChannels)
    : _outputFile (outputFile)
{
    _writeY = (rgbaChannels & WRITE_Y) ? true : false;
    _writeC = (rgbaChannels & WRITE_C) ? true : false;
    _writeA = (rgbaChannels & WRITE_A) ? true : false;

    const Box2i dw = _outputFile.header ().dataWindow ();

    _xMin   = dw.min.x;
    _width  = dw.max.x - dw.min.x + 1;
    _height = dw.max.y - dw.min.y + 1;

    _linesConverted = 0;
    _lineOrder      = _outputFile.header ().lineOrder ();

    if (_lineOrder == INCREASING_Y)
        _currentScanLine = dw.min.y;
    else
        _currentScanLine = dw.max.y;

    _yw = ywFromHeader (_outputFile.header ());

    ptrdiff_t pad = cachePadding (_width * sizeof (Rgba)) / sizeof (Rgba);

    _bufBase = new Rgba[(_width + pad) * N];

    for (int i = 0; i < N; ++i)
        _buf[i] = _bufBase + (i * (_width + pad));

    _tmpBuf = new Rgba[_width + N - 1];

    _fbBase    = 0;
    _fbXStride = 0;
    _fbYStride = 0;

    _roundY = 7;
    _roundC = 5;
}